

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

void Aig_ManChoiceLevel_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  Aig_Obj_t *pAVar7;
  
  if (pObj->TravId != p->nTravIds) {
    pObj->TravId = p->nTravIds;
    uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar4 = uVar3 & 7;
    if (uVar4 == 3) {
      pAVar7 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      Aig_ManChoiceLevel_rec(p,pAVar7);
      uVar3 = *(uint *)&pAVar7->field_0x1c;
    }
    else if (uVar4 == 2) {
      uVar3 = 0;
      if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
        iVar1 = Tim_ManBoxForCi((Tim_Man_t *)p->pManTime,(pObj->field_0).CioId);
        uVar3 = 0;
        if (-1 < iVar1) {
          iVar2 = Tim_ManBoxInputFirst((Tim_Man_t *)p->pManTime,iVar1);
          uVar3 = Tim_ManBoxInputNum((Tim_Man_t *)p->pManTime,iVar1);
          if ((int)uVar3 < 1) {
            uVar3 = 1;
          }
          else {
            lVar6 = (long)iVar2;
            uVar5 = (ulong)uVar3;
            uVar3 = 0;
            do {
              if ((iVar2 < 0) || (p->vCos->nSize <= lVar6)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pAVar7 = (Aig_Obj_t *)p->vCos->pArray[lVar6];
              Aig_ManChoiceLevel_rec(p,pAVar7);
              if (((ulong)pAVar7 & 1) != 0) {
                __assert_fail("!Aig_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                              ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
              }
              uVar4 = *(uint *)&pAVar7->field_0x1c & 0xffffff;
              if (uVar3 <= uVar4) {
                uVar3 = uVar4;
              }
              lVar6 = lVar6 + 1;
              uVar5 = uVar5 - 1;
            } while (uVar5 != 0);
            uVar3 = uVar3 + 1;
          }
        }
      }
    }
    else if ((uVar3 & 7) - 7 < 0xfffffffe) {
      iVar1 = Aig_ObjIsConst1(pObj);
      uVar3 = 0;
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                      ,0x236,"void Aig_ManChoiceLevel_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
    }
    else {
      pAVar7 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      Aig_ManChoiceLevel_rec(p,pAVar7);
      uVar3 = *(uint *)&pAVar7->field_0x1c & 0xffffff;
      pAVar7 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      Aig_ManChoiceLevel_rec(p,pAVar7);
      if (uVar3 < (*(uint *)&pAVar7->field_0x1c & 0xffffff)) {
        uVar3 = Aig_ObjLevel(pAVar7);
      }
      uVar3 = uVar3 + 1;
      if ((p->pEquivs != (Aig_Obj_t **)0x0) &&
         (pAVar7 = p->pEquivs[pObj->Id], pAVar7 != (Aig_Obj_t *)0x0)) {
        Aig_ManChoiceLevel_rec(p,pAVar7);
        uVar4 = Aig_ObjLevel(pAVar7);
        if (uVar3 < uVar4) {
          uVar3 = Aig_ObjLevel(pAVar7);
        }
      }
    }
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                    ,0x145,"int Aig_ObjSetLevel(Aig_Obj_t *, int)");
    }
    *(ulong *)&pObj->field_0x18 =
         *(ulong *)&pObj->field_0x18 & 0xff000000ffffffff | (ulong)(uVar3 & 0xffffff) << 0x20;
  }
  return;
}

Assistant:

void Aig_ManChoiceLevel_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms, LevelMax = 0;
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Aig_ObjSetTravIdCurrent( p, pObj );
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( p->pManTime )
        {
            iBox = Tim_ManBoxForCi( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj) );
            if ( iBox >= 0 ) // this is not a true PI
            {
                iTerm1 = Tim_ManBoxInputFirst( (Tim_Man_t *)p->pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( (Tim_Man_t *)p->pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Aig_ManCo(p, iTerm1 + i);
                    Aig_ManChoiceLevel_rec( p, pNext );
                    if ( LevelMax < Aig_ObjLevel(pNext) )
                        LevelMax = Aig_ObjLevel(pNext);
                }
                LevelMax++;
            }
        }
//        printf( "%d ", pObj->Level );
    }
    else if ( Aig_ObjIsCo(pObj) )
    {
        pNext = Aig_ObjFanin0(pObj);
        Aig_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Aig_ObjLevel(pNext) )
            LevelMax = Aig_ObjLevel(pNext);
    }
    else if ( Aig_ObjIsNode(pObj) )
    { 
        // get the maximum level of the two fanins
        pNext = Aig_ObjFanin0(pObj);
        Aig_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Aig_ObjLevel(pNext) )
            LevelMax = Aig_ObjLevel(pNext);
        pNext = Aig_ObjFanin1(pObj);
        Aig_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Aig_ObjLevel(pNext) )
            LevelMax = Aig_ObjLevel(pNext);
        LevelMax++;

        // get the level of the nodes in the choice node
        if ( p->pEquivs && (pNext = Aig_ObjEquiv(p, pObj)) )
        {
            Aig_ManChoiceLevel_rec( p, pNext );
            if ( LevelMax < Aig_ObjLevel(pNext) )
                LevelMax = Aig_ObjLevel(pNext);
        }
    }
    else if ( !Aig_ObjIsConst1(pObj) )
        assert( 0 );
    Aig_ObjSetLevel( pObj, LevelMax );
}